

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O2

tmsize_t TIFFWriteEncodedTile(TIFF *tif,uint32_t tile,void *data,tmsize_t cc)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  long n;
  
  uVar3 = (ulong)tile;
  if (((tif->tif_flags & 0x40) != 0) ||
     (iVar5 = TIFFWriteCheck(tif,1,"TIFFWriteEncodedTile"), iVar5 != 0)) {
    if (tile < (tif->tif_dir).td_nstrips) {
      uVar6 = tif->tif_flags;
      if (((uVar6 & 0x10) == 0) || (tif->tif_rawdata == (uint8_t *)0x0)) {
        iVar5 = TIFFWriteBufferSetup(tif,(void *)0x0,-1);
        if (iVar5 == 0) {
          return -1;
        }
        uVar6 = tif->tif_flags;
      }
      tif->tif_flags = uVar6 | 0x100000;
      tif->tif_curtile = tile;
      tif->tif_curoff = 0;
      iVar5 = _TIFFReserveLargeEnoughWriteBuffer(tif,tile);
      if (iVar5 != 0) {
        tif->tif_rawcc = 0;
        tif->tif_rawcp = tif->tif_rawdata;
        uVar6 = (tif->tif_dir).td_imagelength;
        uVar1 = (tif->tif_dir).td_tilelength;
        if ((uVar6 < -uVar1) && (uVar6 = uVar6 - 1, !CARRY4(uVar6,uVar1))) {
          tif->tif_row = (int)(uVar3 % ((ulong)(uVar6 + uVar1) / (ulong)uVar1)) * uVar1;
          uVar6 = (tif->tif_dir).td_imagewidth;
          uVar1 = (tif->tif_dir).td_tilewidth;
          if ((uVar6 < -uVar1) && (uVar6 = uVar6 - 1, !CARRY4(uVar6,uVar1))) {
            tif->tif_col = (int)(uVar3 % ((ulong)(uVar6 + uVar1) / (ulong)uVar1)) * uVar1;
            uVar6 = tif->tif_flags;
            if ((uVar6 & 0x20) == 0) {
              iVar5 = (*tif->tif_setupencode)(tif);
              if (iVar5 == 0) {
                return -1;
              }
              uVar6 = tif->tif_flags | 0x20;
            }
            tif->tif_flags = uVar6 & 0xffffefff;
            lVar2 = tif->tif_tilesize;
            n = cc;
            if (lVar2 < cc) {
              n = lVar2;
            }
            if (cc < 1) {
              n = lVar2;
            }
            if ((tif->tif_dir).td_compression == 1) {
              (*tif->tif_postdecode)(tif,(uint8_t *)data,n);
              if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
                TIFFReverseBits((uint8_t *)data,n);
              }
              if (n < 1) {
                return n;
              }
              iVar5 = TIFFAppendToStrip(tif,tile,(uint8_t *)data,n);
              if (iVar5 == 0) {
                return -1;
              }
              return n;
            }
            uVar4 = (uint16_t)(tile / (tif->tif_dir).td_stripsperimage);
            iVar5 = (*tif->tif_preencode)(tif,uVar4);
            if (iVar5 == 0) {
              return -1;
            }
            (*tif->tif_postdecode)(tif,(uint8_t *)data,n);
            iVar5 = (*tif->tif_encodetile)(tif,(uint8_t *)data,n,uVar4);
            if (iVar5 == 0) {
              return -1;
            }
            iVar5 = (*tif->tif_postencode)(tif);
            if (iVar5 == 0) {
              return -1;
            }
            if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
              TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
            }
            if ((0 < tif->tif_rawcc) &&
               (iVar5 = TIFFAppendToStrip(tif,tile,tif->tif_rawdata,tif->tif_rawcc), iVar5 == 0)) {
              return -1;
            }
            tif->tif_rawcc = 0;
            tif->tif_rawcp = tif->tif_rawdata;
            return n;
          }
        }
        TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Zero tiles");
      }
    }
    else {
      TIFFErrorExtR(tif,"TIFFWriteEncodedTile","Tile %lu out of range, max %lu",uVar3);
    }
  }
  return -1;
}

Assistant:

tmsize_t TIFFWriteEncodedTile(TIFF *tif, uint32_t tile, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteEncodedTile";
    TIFFDirectory *td;
    uint16_t sample;
    uint32_t howmany32;

    if (!WRITECHECKTILES(tif, module))
        return ((tmsize_t)(-1));
    td = &tif->tif_dir;
    if (tile >= td->td_nstrips)
    {
        TIFFErrorExtR(tif, module, "Tile %lu out of range, max %lu",
                      (unsigned long)tile, (unsigned long)td->td_nstrips);
        return ((tmsize_t)(-1));
    }
    /*
     * Handle delayed allocation of data buffer.  This
     * permits it to be sized more intelligently (using
     * directory information).
     */
    if (!BUFFERCHECK(tif))
        return ((tmsize_t)(-1));

    tif->tif_flags |= TIFF_BUF4WRITE;

    tif->tif_curtile = tile;

    /* this informs TIFFAppendToStrip() we have changed or reset tile */
    tif->tif_curoff = 0;

    if (!_TIFFReserveLargeEnoughWriteBuffer(tif, tile))
    {
        return ((tmsize_t)(-1));
    }

    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;

    /*
     * Compute tiles per row & per column to compute
     * current row and column
     */
    howmany32 = TIFFhowmany_32(td->td_imagelength, td->td_tilelength);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return ((tmsize_t)(-1));
    }
    tif->tif_row = (tile % howmany32) * td->td_tilelength;
    howmany32 = TIFFhowmany_32(td->td_imagewidth, td->td_tilewidth);
    if (howmany32 == 0)
    {
        TIFFErrorExtR(tif, module, "Zero tiles");
        return ((tmsize_t)(-1));
    }
    tif->tif_col = (tile % howmany32) * td->td_tilewidth;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupencode)(tif))
            return ((tmsize_t)(-1));
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_flags &= ~TIFF_POSTENCODE;

    /*
     * Clamp write amount to the tile size.  This is mostly
     * done so that callers can pass in some large number
     * (e.g. -1) and have the tile size used instead.
     */
    if (cc < 1 || cc > tif->tif_tilesize)
        cc = tif->tif_tilesize;

    /* shortcut to avoid an extra memcpy() */
    if (td->td_compression == COMPRESSION_NONE)
    {
        /* swab if needed - note that source buffer will be altered */
        tif->tif_postdecode(tif, (uint8_t *)data, cc);

        if (!isFillOrder(tif, td->td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)data, cc);

        if (cc > 0 && !TIFFAppendToStrip(tif, tile, (uint8_t *)data, cc))
            return ((tmsize_t)-1);
        return (cc);
    }

    sample = (uint16_t)(tile / td->td_stripsperimage);
    if (!(*tif->tif_preencode)(tif, sample))
        return ((tmsize_t)(-1));
    /* swab if needed - note that source buffer will be altered */
    tif->tif_postdecode(tif, (uint8_t *)data, cc);

    if (!(*tif->tif_encodetile)(tif, (uint8_t *)data, cc, sample))
        return ((tmsize_t)-1);
    if (!(*tif->tif_postencode)(tif))
        return ((tmsize_t)(-1));
    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
        TIFFReverseBits((uint8_t *)tif->tif_rawdata, tif->tif_rawcc);
    if (tif->tif_rawcc > 0 &&
        !TIFFAppendToStrip(tif, tile, tif->tif_rawdata, tif->tif_rawcc))
        return ((tmsize_t)(-1));
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
    return (cc);
}